

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O2

Extra_UnateInfo_t * Extra_UnateComputeSlow(DdManager *dd,DdNode *bFunc)

{
  Extra_UnateVar_t *pEVar1;
  int iVar2;
  DdNode *n;
  Extra_UnateInfo_t *pEVar3;
  uint uVar4;
  DdNode *pDVar5;
  uint uVar6;
  long lVar7;
  
  n = Cudd_Support(dd,bFunc);
  Cudd_Ref(n);
  iVar2 = Extra_bddSuppSize(dd,n);
  pEVar3 = Extra_UnateInfoAllocate(iVar2);
  pEVar3->nVarsMax = dd->size;
  lVar7 = 0;
  pDVar5 = n;
  do {
    if (pDVar5 == dd->one) {
      Cudd_RecursiveDeref(dd,n);
      return pEVar3;
    }
    iVar2 = Extra_bddCheckUnateNaive(dd,bFunc,pDVar5->index);
    pEVar1 = pEVar3->pVars;
    uVar4 = *(uint *)(&pEVar1->field_0x0 + lVar7) & 0xc0000000 | pDVar5->index & 0x3fffffff;
    *(uint *)(&pEVar1->field_0x0 + lVar7) = uVar4;
    if (iVar2 == -1) {
      uVar6 = 0x80000000;
LAB_00689477:
      *(uint *)(&pEVar1->field_0x0 + lVar7) = uVar4 | uVar6;
    }
    else if (iVar2 == 1) {
      uVar6 = 0x40000000;
      goto LAB_00689477;
    }
    pEVar3->nUnate = (pEVar3->nUnate + 1) - (uint)(iVar2 == 0);
    pDVar5 = (pDVar5->type).kids.T;
    lVar7 = lVar7 + 4;
  } while( true );
}

Assistant:

Extra_UnateInfo_t * Extra_UnateComputeSlow( DdManager * dd, DdNode * bFunc )
{
    int nSuppSize;
    DdNode * bSupp, * bTemp;
    Extra_UnateInfo_t * p;
    int i, Res;

    // compute the support
    bSupp = Cudd_Support( dd, bFunc );   Cudd_Ref( bSupp );
    nSuppSize = Extra_bddSuppSize( dd, bSupp );
//printf( "Support = %d. ", nSuppSize );
//Extra_bddPrint( dd, bSupp );
//printf( "%d ", nSuppSize );

    // allocate the storage for symmetry info
    p = Extra_UnateInfoAllocate( nSuppSize );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        Res = Extra_bddCheckUnateNaive( dd, bFunc, bTemp->index );
        p->pVars[i].iVar = bTemp->index;
        if ( Res == -1 )
            p->pVars[i].Neg = 1;
        else if ( Res == 1 )
            p->pVars[i].Pos = 1;
        p->nUnate += (Res != 0);
    }
    Cudd_RecursiveDeref( dd, bSupp );
    return p;

}